

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cimgui-ext.cpp
# Opt level: O3

void ImDrawList_AddRect(ImDrawList *self,ImVec2 a,ImVec2 b,ImU32 col,float rounding,
                       int rounding_corners_flags,float thickness)

{
  ImVec2 local_10;
  ImVec2 local_8;
  
  local_10 = b;
  local_8 = a;
  ImDrawList::AddRect(self,&local_8,&local_10,col,rounding,rounding_corners_flags,thickness);
  return;
}

Assistant:

CIMGUI_API void _ImDrawList_AddRect (ImDrawList *larg1, ImVec2 const *larg2, ImVec2 const *larg3, ImU32 *larg4, float larg5, int larg6, float larg7) {
  ImDrawList *arg1 = (ImDrawList *) 0 ;
  ImVec2 arg2 ;
  ImVec2 arg3 ;
  ImU32 arg4 ;
  float arg5 ;
  int arg6 ;
  float arg7 ;
  
  arg1 = larg1;
  arg2 = *larg2;
  arg3 = *larg3;
  arg4 = *larg4;
  arg5 = larg5;
  arg6 = larg6;
  arg7 = larg7;
  try {
    ImDrawList_AddRect(arg1,arg2,arg3,arg4,arg5,arg6,arg7);
    
  } catch (...) {
    
  }
}